

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanohttp.cpp
# Opt level: O2

void __thiscall HTTP::Tick(HTTP *this,double timeout)

{
  string *this_00;
  bool bVar1;
  int iVar2;
  long lVar3;
  string sStack_38;
  
  bVar1 = Client::Select(this->client,timeout);
  if (bVar1) {
    Client::Recv_abi_cxx11_(&sStack_38,this->client,0x2000);
    std::__cxx11::string::append((string *)&this->response);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  bVar1 = Client::Connected(this->client);
  if (!bVar1) {
    this_00 = &this->response;
    if (0xc < (this->response)._M_string_length) {
      std::__cxx11::string::substr((ulong)&sStack_38,(ulong)this_00);
      iVar2 = util::to_int(&sStack_38);
      this->status = iVar2;
      std::__cxx11::string::~string((string *)&sStack_38);
    }
    lVar3 = std::__cxx11::string::find((char *)this_00,0x185abc);
    if (lVar3 == -1) {
      std::__cxx11::string::assign((char *)this_00);
    }
    else {
      std::__cxx11::string::substr((ulong)&sStack_38,(ulong)this_00);
      std::__cxx11::string::operator=((string *)this_00,(string *)&sStack_38);
      std::__cxx11::string::~string((string *)&sStack_38);
    }
    this->done = true;
  }
  return;
}

Assistant:

void HTTP::Tick(double timeout)
{
	if (this->client->Select(timeout))
	{
		this->response += this->client->Recv(8192);
	}

	if (!this->client->Connected())
	{
		if (this->response.length() > 12)
		{
			this->status = util::to_int(this->response.substr(9,3));
		}

		std::size_t startcontent = this->response.find("\r\n\r\n");

		if (startcontent == std::string::npos)
		{
			this->response = "";
		}
		else
		{
			this->response = this->response.substr(startcontent+4);
		}

		this->done = true;
	}
}